

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O2

void art_replace(art_inner_node_t *node,art_key_chunk_t key_chunk,art_node_t *new_child)

{
  long lVar1;
  uint8_t *puVar2;
  ulong uVar3;
  
  switch(node->typecode) {
  case '\0':
    puVar2 = node[2].prefix;
    uVar3 = 0;
    while( true ) {
      if (node[1].typecode == uVar3) {
        return;
      }
      if (node[1].prefix[uVar3 - 1] == key_chunk) break;
      uVar3 = uVar3 + 1;
      puVar2 = puVar2 + 8;
    }
    break;
  case '\x01':
    puVar2 = node[2].prefix;
    uVar3 = 0;
    do {
      if (node[1].typecode == uVar3) {
        return;
      }
      puVar2 = puVar2 + 8;
      lVar1 = uVar3 - 1;
      uVar3 = uVar3 + 1;
    } while (node[1].prefix[lVar1] != key_chunk);
    break;
  case '\x02':
    puVar2 = (uint8_t *)((long)node + (ulong)node[2].prefix[key_chunk] * 8 + 0x110);
    break;
  case '\x03':
    puVar2 = (uint8_t *)((long)node + (ulong)key_chunk * 8 + 0x10);
    break;
  default:
    goto switchD_0010be29_default;
  }
  *(art_node_t **)puVar2 = new_child;
switchD_0010be29_default:
  return;
}

Assistant:

static void art_replace(art_inner_node_t *node, art_key_chunk_t key_chunk,
                        art_node_t *new_child) {
    switch (art_get_type(node)) {
        case ART_NODE4_TYPE:
            art_node4_replace((art_node4_t *)node, key_chunk, new_child);
            break;
        case ART_NODE16_TYPE:
            art_node16_replace((art_node16_t *)node, key_chunk, new_child);
            break;
        case ART_NODE48_TYPE:
            art_node48_replace((art_node48_t *)node, key_chunk, new_child);
            break;
        case ART_NODE256_TYPE:
            art_node256_replace((art_node256_t *)node, key_chunk, new_child);
            break;
        default:
            assert(false);
    }
}